

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ToStringVisitor.cpp
# Opt level: O2

bool __thiscall binlog::ToStringVisitor::visit(ToStringVisitor *this,StructBegin sb,Range *input)

{
  OstreamBuffer *this_00;
  StructBegin sb_00;
  bool bVar1;
  undefined7 extraout_var;
  size_t in_RCX;
  string_view sVar2;
  
  comma(this);
  if (this->_pp != (PrettyPrinter *)0x0) {
    sb_00.name._len = sb.name._len;
    sb_00.name._ptr = sb.name._ptr;
    sb_00.tag._ptr = sb.tag._ptr;
    sb_00.tag._len = sb.tag._len;
    bVar1 = PrettyPrinter::printStruct(this->_pp,this->_out,sb_00,input);
    in_RCX = CONCAT71(extraout_var,bVar1) & 0xffffffff;
    if ((char)in_RCX != '\0') {
      return true;
    }
  }
  this_00 = this->_out;
  sVar2 = mserialize::detail::remove_prefix_before(&sb.name,'<');
  detail::OstreamBuffer::write(this_00,(int)sVar2._ptr,(void *)sVar2._len,in_RCX);
  if (sb.tag._len == 0) {
    this->_emptyStruct = true;
  }
  else {
    detail::OstreamBuffer::operator<<(this->_out,"{ ");
    this->_state = SeqBegin;
    this->_seqDepth = this->_seqDepth + 1;
  }
  return false;
}

Assistant:

bool ToStringVisitor::visit(mserialize::Visitor::StructBegin sb, Range& input)
{
  comma();

  if (_pp != nullptr && _pp->printStruct(_out, sb, input))
  {
    return true;
  }

  _out << mserialize::detail::remove_prefix_before(sb.name, '<');
  if (sb.tag.empty())
  {
    _emptyStruct = true;
  }
  else
  {
    _out << "{ ";
    enterSeq();
  }

  return false;
}